

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

Vec_Flt_t * Abc_NtkTestCreateArrivals(int nInputs)

{
  Vec_Flt_t *p_00;
  undefined4 local_1c;
  int i;
  Vec_Flt_t *p;
  int nInputs_local;
  
  p_00 = Vec_FltAlloc(nInputs);
  for (local_1c = 0; local_1c < nInputs; local_1c = local_1c + 1) {
    Vec_FltPush(p_00,(float)(local_1c % 10) * 1.0);
  }
  return p_00;
}

Assistant:

Vec_Flt_t * Abc_NtkTestCreateArrivals( int nInputs )
{
    Vec_Flt_t * p;
    int i;
    p = Vec_FltAlloc( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Vec_FltPush( p, 1.0*(i % 10) );
    return p;
}